

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

PropertyQueryFlags __thiscall
Js::JavascriptString::HasPropertyQuery
          (JavascriptString *this,PropertyId propertyId,PropertyValueInfo *info)

{
  PropertyQueryFlags PVar1;
  BOOL BVar2;
  undefined8 uStack_18;
  charcount_t index;
  
  PVar1 = Property_Found;
  if (propertyId != 0xd1) {
    uStack_18 = 1;
    BVar2 = ScriptContext::IsNumericPropertyId
                      ((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr,propertyId,
                       (uint32 *)((long)&uStack_18 + 4));
    if ((BVar2 != 0) && (uStack_18._4_4_ < this->m_charLength)) {
      return Property_Found;
    }
    PVar1 = Property_NotFound;
  }
  return PVar1;
}

Assistant:

PropertyQueryFlags JavascriptString::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        if (propertyId == PropertyIds::length)
        {
            return PropertyQueryFlags::Property_Found;
        }
        ScriptContext* scriptContext = GetScriptContext();
        charcount_t index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            if (index < this->GetLength())
            {
                return PropertyQueryFlags::Property_Found;
            }
        }
        return PropertyQueryFlags::Property_NotFound;
    }